

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

char * generic_reader(lua_State *L,void *ud,size_t *size)

{
  int iVar1;
  char *pcVar2;
  
  luaL_checkstack(L,2,"too many nested functions");
  lua_pushvalue(L,1);
  lua_callk(L,0,1,0,(lua_KFunction)0x0);
  iVar1 = lua_type(L,-1);
  if (iVar1 != 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      luaL_error(L,"reader function must return a string");
    }
    lua_copy(L,-1,5);
    lua_settop(L,-2);
    pcVar2 = lua_tolstring(L,5,size);
    return pcVar2;
  }
  lua_settop(L,-2);
  *size = 0;
  return (char *)0x0;
}

Assistant:

static const char *generic_reader(lua_State *L, void *ud, size_t *size) {
    (void) (ud);  /* not used */
    luaL_checkstack(L, 2, "too many nested functions");
    lua_pushvalue(L, 1);  /* get function */
    lua_call(L, 0, 1);  /* call it */
    if (lua_isnil(L, -1)) {
        lua_pop(L, 1);  /* pop result */
        *size = 0;
        return NULL;
    } else if (!lua_isstring(L, -1))
        luaL_error(L, "reader function must return a string");
    lua_replace(L, RESERVEDSLOT);  /* save string in reserved slot */
    return lua_tolstring(L, RESERVEDSLOT, size);
}